

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::ios_info::string_set::get<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,string_set *this)

{
  char *__s1;
  int iVar1;
  undefined8 *puVar2;
  allocator local_11;
  
  if (this->type != (type_info *)0x0) {
    __s1 = *(char **)(this->type + 8);
    if (__s1 == __M_widen_init) {
LAB_0018533a:
      std::__cxx11::wstring::wstring
                ((wstring *)__return_storage_ptr__,(wchar_t *)this->ptr,&local_11);
      return __return_storage_ptr__;
    }
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,__M_widen_init);
      if (iVar1 == 0) goto LAB_0018533a;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::__cxx11::moneypunct<char,true>::id;
  __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::basic_string<Char> get() const
                {
                    if(type==0 || *type!=typeid(Char))
                        throw std::bad_cast();
                    std::basic_string<Char> result = reinterpret_cast<Char const *>(ptr);
                    return result;
                }